

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_CutDsdBalanceEvalInt
              (If_DsdMan_t *p,int iDsd,int *pTimes,Vec_Int_t *vAig,int *pArea,char *pPermLits)

{
  int iVar1;
  uint Id;
  uint nSuppAll;
  int iLit;
  int nSupp;
  
  _iLit = 0;
  if (-1 < iDsd) {
    Id = (uint)iDsd >> 1;
    if ((p->vObjs).nSize <= (int)Id) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    nSuppAll = *(uint *)((long)(p->vObjs).pArray[Id] + 4) >> 3 & 0x1f;
    iVar1 = If_CutDsdBalanceEval_rec(p,Id,pTimes,&nSupp,vAig,&iLit,nSuppAll,pArea,pPermLits);
    if (iVar1 != -1) {
      if (nSupp != nSuppAll) {
        __assert_fail("nSupp == nSuppAll",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                      ,0x90b,
                      "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                     );
      }
      if (vAig != (Vec_Int_t *)0x0) {
        if ((iLit < 0) || (vAig->nSize < 0)) goto LAB_003fef78;
        if ((uint)iLit >> 1 != (((uint)vAig->nSize >> 1) + nSuppAll) - 1) {
          __assert_fail("vAig == NULL || Abc_Lit2Var(iLit) == nSupp + Abc_Lit2Var(Vec_IntSize(vAig)) - 1"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                        ,0x90c,
                        "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                       );
        }
        Vec_IntPush(vAig,(iLit ^ iDsd) & 1);
        if ((vAig->nSize & 1) == 0) {
          __assert_fail("vAig == NULL || (Vec_IntSize(vAig) & 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                        ,0x90f,
                        "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                       );
        }
      }
    }
    return iVar1;
  }
LAB_003fef78:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int If_CutDsdBalanceEvalInt( If_DsdMan_t * p, int iDsd, int * pTimes, Vec_Int_t * vAig, int * pArea, char * pPermLits )
{
    int nSupp = 0, iLit = 0;
    int nSuppAll = If_DsdVecLitSuppSize( &p->vObjs, iDsd );
    int Res = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iDsd), pTimes, &nSupp, vAig, &iLit, nSuppAll, pArea, pPermLits );
    if ( Res == -1 )
        return -1;
    assert( nSupp == nSuppAll );
    assert( vAig == NULL || Abc_Lit2Var(iLit) == nSupp + Abc_Lit2Var(Vec_IntSize(vAig)) - 1 );
    if ( vAig )
        Vec_IntPush( vAig, Abc_LitIsCompl(iLit) ^ Abc_LitIsCompl(iDsd) );
    assert( vAig == NULL || (Vec_IntSize(vAig) & 1) );
    return Res;
}